

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O0

void project_m_apply_side_effects(project_monster_handler_context_t *context,wchar_t m_idx)

{
  wchar_t wVar1;
  loc_conflict grid_00;
  _Bool _Var2;
  uint32_t uVar3;
  monster_race *race;
  monster *pmVar4;
  source origin;
  monster_race *local_60;
  uint32_t local_58;
  wchar_t local_54;
  char local_4d;
  wchar_t i;
  monster_group_info mStack_48;
  char dice [5];
  monster_group_info info;
  monster_race *new;
  monster_race *old;
  wchar_t savelvl;
  loc grid;
  mon_messages hurt_msg;
  monster *mon;
  wchar_t typ;
  wchar_t m_idx_local;
  project_monster_handler_context_t *context_local;
  
  wVar1 = context->type;
  pmVar4 = context->mon;
  if (context->do_poly == L'\0') {
    if (context->teleport_distance < L'\x01') {
      for (local_54 = L'\0'; local_54 < L'\n'; local_54 = local_54 + L'\x01') {
        if ((L'\0' < context->mon_timed[local_54]) &&
           (mon_inc_timed(pmVar4,local_54,context->mon_timed[local_54],context->flag | 1),
           (context->seen & 1U) != 0)) {
          context->obvious = true;
        }
      }
    }
    else {
      strnfmt(&local_4d,5,"%d",(ulong)(uint)context->teleport_distance);
      origin._4_4_ = 0;
      origin.what = (context->origin).what;
      origin.which.trap = (context->origin).which.trap;
      effect_simple(L':',origin,&local_4d,L'\0',L'\0',L'\0',(context->grid).y,(context->grid).x,
                    (_Bool *)0x0);
      monster_wake(pmVar4,false,L'\0');
    }
  }
  else {
    grid.x = 8;
    grid_00 = context->grid;
    _Var2 = monster_is_unique(pmVar4);
    if ((_Var2) || ((player->upkeep->arena_level & 1U) != 0)) {
      if ((context->seen & 1U) != 0) {
        add_monster_message(pmVar4,L'\b',false);
      }
    }
    else {
      if ((context->seen & 1U) != 0) {
        context->obvious = true;
      }
      if (wVar1 == L'/') {
        if (context->do_poly + L'\xfffffff6' < 2) {
          local_58 = 1;
        }
        else {
          local_58 = context->do_poly + L'\xfffffff6';
        }
        uVar3 = Rand_div(local_58);
        old._0_4_ = uVar3 + L'\v';
      }
      else {
        uVar3 = Rand_div(0x5a);
        old._0_4_ = uVar3 + L'\x01';
      }
      if ((wchar_t)old < pmVar4->race->level) {
        if (wVar1 == L'/') {
          grid.x = 0x31;
        }
        if ((context->seen & 1U) != 0) {
          add_monster_message(pmVar4,grid.x,false);
        }
      }
      else {
        if (pmVar4->original_race == (monster_race *)0x0) {
          local_60 = pmVar4->race;
        }
        else {
          local_60 = pmVar4->original_race;
        }
        race = poly_race(local_60,(int)player->depth);
        if (race == local_60) {
          if ((context->seen & 1U) != 0) {
            add_monster_message(pmVar4,L'\b',false);
          }
        }
        else {
          memset(&stack0xffffffffffffffb8,0,8);
          if ((context->seen & 1U) != 0) {
            add_monster_message(pmVar4,L'\x14',false);
          }
          delete_monster_idx((chunk *)cave,m_idx);
          place_new_monster((chunk *)cave,grid_00,race,false,false,mStack_48,'\x17');
          pmVar4 = square_monster((chunk *)cave,grid_00);
          context->mon = pmVar4;
          if ((((context->seen & 1U) == 0) && (context->mon != (monster *)0x0)) &&
             (_Var2 = monster_is_visible(context->mon), _Var2)) {
            add_monster_message(context->mon,L'3',false);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void project_m_apply_side_effects(project_monster_handler_context_t *context, int m_idx)
{
	int typ = context->type;
	struct monster *mon = context->mon;

	/*
	 * Handle side effects of an attack. First we check for polymorphing since
	 * it may not make sense to apply status effects to a changed monster.
	 * Right now, teleporting is also separate, but it could make sense in the
	 * future to change it so that we can apply other effects AND teleport the
	 * monster.
	 */
	if (context->do_poly) {
		enum mon_messages hurt_msg = MON_MSG_UNAFFECTED;
		const struct loc grid = context->grid;
		int savelvl = 0;
		struct monster_race *old;
		struct monster_race *new;

		/* Uniques cannot be polymorphed; nor can an arena monster */
		if (monster_is_unique(mon) || player->upkeep->arena_level) {
			if (context->seen) add_monster_message(mon, hurt_msg, false);
			return;
		}

		if (context->seen) context->obvious = true;

		/* Saving throws depend on damage for direct poly, random for chaos */
		if (typ == PROJ_MON_POLY)
			savelvl = randint1(MAX(1, context->do_poly - 10)) + 10;
		else
			savelvl = randint1(90);
		if (mon->race->level > savelvl) {
			if (typ == PROJ_MON_POLY) hurt_msg = MON_MSG_MAINTAIN_SHAPE;
			if (context->seen) add_monster_message(mon, hurt_msg, false);
			return;
		}

		old = (mon->original_race) ? mon->original_race : mon->race;
		new = poly_race(old, player->depth);

		/* Handle polymorph */
		if (new != old) {
			struct monster_group_info info = {0, 0 };

			/* Report the polymorph before changing the monster */
			hurt_msg = MON_MSG_CHANGE;
			if (context->seen) add_monster_message(mon, hurt_msg, false);

			/* Delete the old monster, and return a new one */
			delete_monster_idx(cave, m_idx);
			place_new_monster(cave, grid, new, false, false, info,
							  ORIGIN_DROP_POLY);
			context->mon = square_monster(cave, grid);
			/*
			 * Note the appearance of the new one if it is visible
			 * but the old one wasn't.
			 */
			if (!context->seen && context->mon
					&& monster_is_visible(context->mon)) {
				add_monster_message(context->mon,
					MON_MSG_APPEAR, false);
			}
		} else if (context->seen) {
			add_monster_message(mon, hurt_msg, false);
		}
	} else if (context->teleport_distance > 0) {
		char dice[5];
		strnfmt(dice, sizeof(dice), "%d", context->teleport_distance);
		effect_simple(EF_TELEPORT, context->origin, dice, 0, 0, 0,
					  context->grid.y, context->grid.x, NULL);

		/* Wake the monster up, don't notice the player */
		monster_wake(mon, false, 0);
	} else {
		for (int i = 0; i < MON_TMD_MAX; i++) {
			if (context->mon_timed[i] > 0) {
				mon_inc_timed(mon,
							  i,
							  context->mon_timed[i],
							  context->flag | MON_TMD_FLG_NOTIFY);
				if (context->seen) context->obvious = true;
			}
		}
	}
}